

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O1

float gimage::expandGaussPixel<unsigned_char>
                (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long i,long k,
                int j)

{
  uchar **ppuVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  lVar5 = i >> 1;
  lVar10 = k >> 1;
  if ((i & 1U) == 0) {
    lVar8 = 1;
    if (1 < lVar5) {
      lVar8 = lVar5;
    }
    lVar11 = image->width + -1;
    lVar12 = lVar8 + -1;
    if (lVar11 <= lVar8 + -1) {
      lVar12 = lVar11;
    }
    if ((k & 1U) == 0) {
      lVar8 = 1;
      if (1 < lVar10) {
        lVar8 = lVar10;
      }
      lVar6 = image->height + -1;
      lVar13 = lVar8 + -1;
      if (lVar6 <= lVar8 + -1) {
        lVar13 = lVar6;
      }
      if (j < 1) {
        j = 0;
      }
      iVar7 = image->depth + -1;
      if (j < iVar7) {
        iVar7 = j;
      }
      ppuVar1 = image->img[iVar7];
      puVar2 = ppuVar1[lVar13];
      lVar8 = 0;
      if (0 < lVar5) {
        lVar8 = lVar5;
      }
      if (lVar5 < 0) {
        lVar5 = -1;
      }
      if (lVar11 <= lVar8) {
        lVar8 = lVar11;
      }
      lVar13 = lVar5 + 1;
      if (lVar11 <= lVar5 + 1) {
        lVar13 = lVar11;
      }
      lVar5 = 0;
      if (0 < lVar10) {
        lVar5 = lVar10;
      }
      lVar11 = -1;
      if (-1 < lVar10) {
        lVar11 = lVar10;
      }
      if (lVar6 <= lVar5) {
        lVar5 = lVar6;
      }
      puVar3 = ppuVar1[lVar5];
      lVar5 = lVar11 + 1;
      if (lVar6 <= lVar11 + 1) {
        lVar5 = lVar6;
      }
      puVar4 = ppuVar1[lVar5];
      fVar14 = (float)puVar4[lVar13] * 0.0039062 +
               (float)puVar4[lVar12] * 0.0039062 + (float)puVar4[lVar8] * 0.0234375 +
               (float)puVar3[lVar13] * 0.0234375 +
               (float)puVar3[lVar12] * 0.0234375 + (float)puVar3[lVar8] * 0.140625 +
               (float)puVar2[lVar13] * 0.0039062 +
               (float)puVar2[lVar12] * 0.0039062 + (float)puVar2[lVar8] * 0.0234375;
      goto LAB_001251e1;
    }
    lVar13 = image->height + -1;
    lVar8 = 0;
    if (0 < lVar10) {
      lVar8 = lVar10;
    }
    if (lVar10 < 0) {
      lVar10 = -1;
    }
    if (lVar13 <= lVar8) {
      lVar8 = lVar13;
    }
    iVar7 = 0;
    if (0 < j) {
      iVar7 = j;
    }
    iVar9 = image->depth + -1;
    if (iVar7 < iVar9) {
      iVar9 = iVar7;
    }
    puVar2 = image->img[iVar9][lVar8];
    lVar8 = 0;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    lVar6 = -1;
    if (-1 < lVar5) {
      lVar6 = lVar5;
    }
    if (lVar11 <= lVar8) {
      lVar8 = lVar11;
    }
    lVar5 = lVar6 + 1;
    if (lVar11 <= lVar6 + 1) {
      lVar5 = lVar11;
    }
    lVar11 = lVar10 + 1;
    if (lVar13 <= lVar10 + 1) {
      lVar11 = lVar13;
    }
    puVar3 = image->img[iVar9][lVar11];
    fVar15 = (float)puVar2[lVar5] * 0.015625 +
             (float)puVar2[lVar12] * 0.015625 + (float)puVar2[lVar8] * 0.09375;
    fVar14 = (float)puVar3[lVar5] * 0.015625 +
             (float)puVar3[lVar12] * 0.015625 + (float)puVar3[lVar8] * 0.09375;
  }
  else {
    lVar8 = 0;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    lVar12 = image->width + -1;
    if (lVar12 <= lVar8) {
      lVar8 = lVar12;
    }
    if ((k & 1U) != 0) {
      lVar13 = image->height + -1;
      lVar11 = 0;
      if (0 < lVar10) {
        lVar11 = lVar10;
      }
      if (lVar10 < 0) {
        lVar10 = -1;
      }
      if (lVar13 <= lVar11) {
        lVar11 = lVar13;
      }
      iVar7 = 0;
      if (0 < j) {
        iVar7 = j;
      }
      iVar9 = image->depth + -1;
      if (iVar7 < iVar9) {
        iVar9 = iVar7;
      }
      puVar2 = image->img[iVar9][lVar11];
      lVar11 = -1;
      if (-1 < lVar5) {
        lVar11 = lVar5;
      }
      lVar5 = lVar11 + 1;
      if (lVar12 <= lVar11 + 1) {
        lVar5 = lVar12;
      }
      lVar12 = lVar10 + 1;
      if (lVar13 <= lVar10 + 1) {
        lVar12 = lVar13;
      }
      puVar3 = image->img[iVar9][lVar12];
      return (float)((uint)puVar3[lVar5] + (uint)puVar3[lVar8] +
                     (uint)puVar2[lVar5] + (uint)puVar2[lVar8] >> 2);
    }
    lVar11 = 1;
    if (1 < lVar10) {
      lVar11 = lVar10;
    }
    lVar6 = image->height + -1;
    lVar13 = lVar11 + -1;
    if (lVar6 <= lVar11 + -1) {
      lVar13 = lVar6;
    }
    if (j < 1) {
      j = 0;
    }
    iVar7 = image->depth + -1;
    if (j < iVar7) {
      iVar7 = j;
    }
    ppuVar1 = image->img[iVar7];
    if (lVar5 < 0) {
      lVar5 = -1;
    }
    lVar11 = lVar5 + 1;
    if (lVar12 <= lVar5 + 1) {
      lVar11 = lVar12;
    }
    lVar5 = 0;
    if (0 < lVar10) {
      lVar5 = lVar10;
    }
    lVar12 = -1;
    if (-1 < lVar10) {
      lVar12 = lVar10;
    }
    if (lVar6 <= lVar5) {
      lVar5 = lVar6;
    }
    lVar10 = lVar12 + 1;
    if (lVar6 <= lVar12 + 1) {
      lVar10 = lVar6;
    }
    fVar15 = (float)ppuVar1[lVar5][lVar8] * 0.09375 + (float)ppuVar1[lVar5][lVar11] * 0.09375 +
             (float)ppuVar1[lVar13][lVar8] * 0.015625 + (float)ppuVar1[lVar13][lVar11] * 0.015625;
    fVar14 = (float)ppuVar1[lVar10][lVar8] * 0.015625 + (float)ppuVar1[lVar10][lVar11] * 0.015625;
  }
  fVar14 = fVar14 + fVar15;
LAB_001251e1:
  return fVar14 * 4.0;
}

Assistant:

float expandGaussPixel(const Image<T> &image, long i, long k, int j)
{
  static const float g[5][5]=
  {
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0234375f, 0.0937500f, 0.1406250f, 0.0937500f, 0.0234375f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
  };

  float ret;

  if (i&0x1)
  {
    if (k&0x1)
    {
      long ii=i>>1;
      long kk=k>>1;

      ret=static_cast<float>((image.getBounds(ii, kk, j)+image.getBounds(ii+1, kk, j)+
                             image.getBounds(ii, kk+1, j)+image.getBounds(ii+1, kk+1, j))/4);
    }
    else
    {
      long ii=i>>1;
      long kk=(k>>1)-1;

      ret =g[0][1]*image.getBounds(ii, kk, j)+g[0][3]*image.getBounds(ii+1, kk, j);
      ret+=g[2][1]*image.getBounds(ii, kk+1, j)+g[2][3]*image.getBounds(ii+1, kk+1, j);
      ret+=g[4][1]*image.getBounds(ii, kk+2, j)+g[4][3]*image.getBounds(ii+1, kk+2, j);
      ret*=4;
    }
  }
  else
  {
    if (k&0x1)
    {
      long ii=(i>>1)-1;
      long kk=k>>1;

      ret =g[1][0]*image.getBounds(ii, kk, j)+g[1][2]*image.getBounds(ii+1, kk, j)+g[1][4]*image.getBounds(ii+2, kk, j);
      ret+=g[3][0]*image.getBounds(ii, kk+1, j)+g[3][2]*image.getBounds(ii+1, kk+1, j)+g[3][4]*image.getBounds(ii+2, kk+1, j);
      ret*=4;
    }
    else
    {
      long ii=(i>>1)-1;
      long kk=(k>>1)-1;

      ret =g[0][0]*image.getBounds(ii, kk, j)+g[0][2]*image.getBounds(ii+1, kk, j)+g[0][4]*image.getBounds(ii+2, kk, j);
      ret+=g[2][0]*image.getBounds(ii, kk+1, j)+g[2][2]*image.getBounds(ii+1, kk+1, j)+g[2][4]*image.getBounds(ii+2, kk+1, j);
      ret+=g[4][0]*image.getBounds(ii, kk+2, j)+g[4][2]*image.getBounds(ii+1, kk+2, j)+g[4][4]*image.getBounds(ii+2, kk+2, j);
      ret*=4;
    }
  }

  return ret;
}